

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls1_prf.c
# Opt level: O0

int tls1_prf_P_hash(EVP_MAC_CTX *ctx_init,uchar *sec,size_t sec_len,uchar *seed,size_t seed_len,
                   uchar *out,size_t olen)

{
  int iVar1;
  size_t sVar2;
  EVP_MAC_CTX *pEVar3;
  long in_RCX;
  void *in_R9;
  int ret;
  size_t Ai_len;
  uchar Ai [64];
  EVP_MAC_CTX *ctx_Ai;
  EVP_MAC_CTX *ctx;
  size_t chunk;
  uint in_stack_ffffffffffffff68;
  int iVar4;
  EVP_MAC_CTX *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  EVP_MAC_CTX *in_stack_ffffffffffffff80;
  void *local_30;
  
  iVar4 = 0;
  iVar1 = EVP_MAC_init(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                       (size_t)in_stack_ffffffffffffff70,
                       (OSSL_PARAM *)(ulong)in_stack_ffffffffffffff68);
  if ((((iVar1 != 0) && (sVar2 = EVP_MAC_CTX_get_mac_size((EVP_MAC_CTX *)0x32db28), sVar2 != 0)) &&
      (pEVar3 = EVP_MAC_CTX_dup((EVP_MAC_CTX *)CONCAT44(iVar4,in_stack_ffffffffffffff68)),
      pEVar3 != (EVP_MAC_CTX *)0x0)) &&
     ((local_30 = in_R9, in_RCX == 0 ||
      (iVar1 = EVP_MAC_update(in_stack_ffffffffffffff70,
                              (uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff68),0x32db75),
      iVar1 != 0)))) {
    while (iVar1 = EVP_MAC_final(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                 (size_t *)in_stack_ffffffffffffff70,
                                 CONCAT44(iVar4,in_stack_ffffffffffffff68)), iVar1 != 0) {
      EVP_MAC_CTX_free((EVP_MAC_CTX *)0x32dbae);
      pEVar3 = EVP_MAC_CTX_dup((EVP_MAC_CTX *)CONCAT44(iVar4,in_stack_ffffffffffffff68));
      if ((((pEVar3 == (EVP_MAC_CTX *)0x0) ||
           (iVar1 = EVP_MAC_update(in_stack_ffffffffffffff70,
                                   (uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff68),0x32dbea),
           iVar1 == 0)) ||
          ((sVar2 < Ai_len &&
           (pEVar3 = EVP_MAC_CTX_dup((EVP_MAC_CTX *)CONCAT44(iVar4,in_stack_ffffffffffffff68)),
           pEVar3 == (EVP_MAC_CTX *)0x0)))) ||
         ((in_RCX != 0 &&
          (iVar1 = EVP_MAC_update(in_stack_ffffffffffffff70,
                                  (uchar *)CONCAT44(iVar4,in_stack_ffffffffffffff68),0x32dc3d),
          iVar1 == 0)))) break;
      if (Ai_len <= sVar2) {
        iVar1 = EVP_MAC_final(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                              (size_t *)in_stack_ffffffffffffff70,
                              CONCAT44(iVar4,in_stack_ffffffffffffff68));
        if (iVar1 != 0) {
          memcpy(local_30,&stack0xffffffffffffff78,Ai_len);
          iVar4 = 1;
        }
        break;
      }
      iVar1 = EVP_MAC_final(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                            (size_t *)in_stack_ffffffffffffff70,
                            CONCAT44(iVar4,in_stack_ffffffffffffff68));
      if (iVar1 == 0) break;
      EVP_MAC_CTX_free((EVP_MAC_CTX *)0x32dcbe);
      local_30 = (void *)(sVar2 + (long)local_30);
      Ai_len = Ai_len - sVar2;
    }
  }
  EVP_MAC_CTX_free((EVP_MAC_CTX *)0x32dd05);
  EVP_MAC_CTX_free((EVP_MAC_CTX *)0x32dd0f);
  OPENSSL_cleanse(&stack0xffffffffffffff78,0x40);
  return iVar4;
}

Assistant:

static int tls1_prf_P_hash(EVP_MAC_CTX *ctx_init,
                           const unsigned char *sec, size_t sec_len,
                           const unsigned char *seed, size_t seed_len,
                           unsigned char *out, size_t olen)
{
    size_t chunk;
    EVP_MAC_CTX *ctx = NULL, *ctx_Ai = NULL;
    unsigned char Ai[EVP_MAX_MD_SIZE];
    size_t Ai_len;
    int ret = 0;

    if (!EVP_MAC_init(ctx_init, sec, sec_len, NULL))
        goto err;
    chunk = EVP_MAC_CTX_get_mac_size(ctx_init);
    if (chunk == 0)
        goto err;
    /* A(0) = seed */
    ctx_Ai = EVP_MAC_CTX_dup(ctx_init);
    if (ctx_Ai == NULL)
        goto err;
    if (seed != NULL && !EVP_MAC_update(ctx_Ai, seed, seed_len))
        goto err;

    for (;;) {
        /* calc: A(i) = HMAC_<hash>(secret, A(i-1)) */
        if (!EVP_MAC_final(ctx_Ai, Ai, &Ai_len, sizeof(Ai)))
            goto err;
        EVP_MAC_CTX_free(ctx_Ai);
        ctx_Ai = NULL;

        /* calc next chunk: HMAC_<hash>(secret, A(i) + seed) */
        ctx = EVP_MAC_CTX_dup(ctx_init);
        if (ctx == NULL)
            goto err;
        if (!EVP_MAC_update(ctx, Ai, Ai_len))
            goto err;
        /* save state for calculating next A(i) value */
        if (olen > chunk) {
            ctx_Ai = EVP_MAC_CTX_dup(ctx);
            if (ctx_Ai == NULL)
                goto err;
        }
        if (seed != NULL && !EVP_MAC_update(ctx, seed, seed_len))
            goto err;
        if (olen <= chunk) {
            /* last chunk - use Ai as temp bounce buffer */
            if (!EVP_MAC_final(ctx, Ai, &Ai_len, sizeof(Ai)))
                goto err;
            memcpy(out, Ai, olen);
            break;
        }
        if (!EVP_MAC_final(ctx, out, NULL, olen))
            goto err;
        EVP_MAC_CTX_free(ctx);
        ctx = NULL;
        out += chunk;
        olen -= chunk;
    }
    ret = 1;
 err:
    EVP_MAC_CTX_free(ctx);
    EVP_MAC_CTX_free(ctx_Ai);
    OPENSSL_cleanse(Ai, sizeof(Ai));
    return ret;
}